

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_number_to_string.c
# Opt level: O2

size_t cesl_uint_to_str(uint value,char *dst_str,uint8_t base)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  char cVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  char acStack_28 [40];
  
  uVar6 = CONCAT71(in_register_00000011,base) & 0xffffffff;
  uVar2 = (ulong)value;
  for (sVar4 = 0; sVar4 == 0 || (int)uVar2 != 0; sVar4 = sVar4 + 1) {
    cVar5 = (char)(uVar2 % uVar6);
    cVar1 = 'W';
    if (cVar5 < '\n') {
      cVar1 = '0';
    }
    acStack_28[sVar4] = cVar1 + cVar5;
    uVar2 = uVar2 / uVar6;
  }
  if (0 < (long)sVar4) {
    for (pcVar3 = acStack_28 + sVar4; acStack_28 < pcVar3; pcVar3 = pcVar3 + -1) {
      *dst_str = pcVar3[-1];
      dst_str = dst_str + 1;
    }
    *dst_str = '\0';
    return sVar4;
  }
  __assert_fail("(len > 0)&&(\"cesl_uint32_to_str negative lenght\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_strings/cesl_number_to_string.c"
                ,0xb0,"size_t cesl_uint32_to_str(uint32_t, char *, uint8_t)");
}

Assistant:

size_t cesl_uint_to_str(unsigned int value, char* dst_str, uint8_t base)
{
#if (UINT_MAX == UINT64_MAX)
    return cesl_uint64_to_str(value, dst_str, base);
#elif (UINT_MAX == UINT32_MAX)
    return cesl_uint32_to_str(value, dst_str, base);
#else
#error cesl_uint_to_string__not_supported_on_this_platfform
#endif
}